

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QImage>::emplace<QImage>
          (QMovableArrayOps<QImage> *this,qsizetype i,QImage *args)

{
  QImage **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  bool bVar5;
  Inserter local_70;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QImage>).super_QArrayDataPointer<QImage>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QImage>).super_QArrayDataPointer<QImage>.size == i) {
      qVar4 = QArrayDataPointer<QImage>::freeSpaceAtEnd((QArrayDataPointer<QImage> *)this);
      if (qVar4 == 0) goto LAB_00105ddd;
      QImage::QImage((this->super_QGenericArrayOps<QImage>).super_QArrayDataPointer<QImage>.ptr +
                     (this->super_QGenericArrayOps<QImage>).super_QArrayDataPointer<QImage>.size *
                     0x18,args);
LAB_00105ecf:
      pqVar2 = &(this->super_QGenericArrayOps<QImage>).super_QArrayDataPointer<QImage>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_00105e8e;
    }
LAB_00105ddd:
    if (i == 0) {
      qVar4 = QArrayDataPointer<QImage>::freeSpaceAtBegin((QArrayDataPointer<QImage> *)this);
      if (qVar4 != 0) {
        QImage::QImage((this->super_QGenericArrayOps<QImage>).super_QArrayDataPointer<QImage>.ptr +
                       -0x18,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QImage>).super_QArrayDataPointer<QImage>.ptr;
        *ppQVar1 = *ppQVar1 + -0x18;
        goto LAB_00105ecf;
      }
    }
  }
  local_38 = 0xaaaaaaaaaaaaaaaa;
  local_48 = 0xaaaaaaaaaaaaaaaa;
  uStack_40 = 0xaaaaaaaaaaaaaaaa;
  QImage::QImage((QImage *)&local_48,args);
  bVar5 = (this->super_QGenericArrayOps<QImage>).super_QArrayDataPointer<QImage>.size != 0;
  QArrayDataPointer<QImage>::detachAndGrow
            ((QArrayDataPointer<QImage> *)this,(uint)(i == 0 && bVar5),1,(QImage **)0x0,
             (QArrayDataPointer<QImage> *)0x0);
  if (i == 0 && bVar5) {
    QImage::QImage((this->super_QGenericArrayOps<QImage>).super_QArrayDataPointer<QImage>.ptr +
                   -0x18,(QImage *)&local_48);
    ppQVar1 = &(this->super_QGenericArrayOps<QImage>).super_QArrayDataPointer<QImage>.ptr;
    *ppQVar1 = *ppQVar1 + -0x18;
    pqVar2 = &(this->super_QGenericArrayOps<QImage>).super_QArrayDataPointer<QImage>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_70,(QArrayDataPointer<QImage> *)this,i,1);
    QImage::QImage(local_70.displaceFrom,(QImage *)&local_48);
    local_70.displaceFrom = local_70.displaceFrom + 0x18;
    Inserter::~Inserter(&local_70);
  }
  QImage::~QImage((QImage *)&local_48);
LAB_00105e8e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }